

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

bool __thiscall DReachabilityPropagator::propagateRemNode(DReachabilityPropagator *this,int node)

{
  Tint *pTVar1;
  pointer piVar2;
  bool bVar3;
  int *pt;
  iterator __begin1;
  pointer __v;
  vector<int,_std::allocator<int>_> remvd_edges;
  TrailElem local_58;
  vector<int,_std::allocator<int>_> local_48;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar3 = GraphPropagator::coherence_outedges(&this->super_GraphPropagator,node,&local_48);
  piVar2 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((bVar3) &&
     (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    __v = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    do {
      pTVar1 = this->last_state_e + *__v;
      local_58.x = pTVar1->v;
      local_58.sz = 4;
      local_58.pt = &pTVar1->v;
      vec<TrailElem>::push(&engine.trail,&local_58);
      pTVar1->v = 1;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->rem_edge,__v);
      __v = __v + 1;
    } while (__v != piVar2);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool DReachabilityPropagator::propagateRemNode(int node) {
	assert(getNodeVar(node).isFixed());
	assert(getNodeVar(node).isFalse());
	std::vector<int> remvd_edges;
	const bool ok = GraphPropagator::coherence_outedges(node, remvd_edges);
	if (!ok) {
		return false;
	}
	for (const int& remvd_edge : remvd_edges) {
		last_state_e[remvd_edge] = VT_OUT;
		rem_edge.insert(remvd_edge);
	}
	return true;
}